

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  BrotliDictionary *pBVar7;
  int iVar8;
  ushort uVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  int iVar17;
  int *piVar18;
  uint8_t *puVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  ushort uVar23;
  size_t sVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint8_t uVar29;
  ulong uVar30;
  undefined4 uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong local_f0;
  ulong local_e0;
  ulong local_c8;
  ulong local_c0;
  Command_conflict *local_b8;
  ulong local_b0;
  long local_a8;
  uint local_88;
  
  uVar4 = (position - 7) + num_bytes;
  sVar24 = position;
  if (7 < num_bytes) {
    sVar24 = uVar4;
  }
  lVar25 = 0x200;
  if (params->quality < 9) {
    lVar25 = 0x40;
  }
  uVar10 = *last_insert_len;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 8) {
    local_b8 = commands;
LAB_0010e9f9:
    *last_insert_len = (uVar10 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_b8 - (long)commands >> 4);
    return;
  }
  uVar38 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar26 = lVar25 + position;
  lVar3 = position - 1;
  local_b8 = commands;
  uVar20 = position;
LAB_0010dbec:
  local_f0 = uVar1 - uVar20;
  uVar30 = uVar38;
  if (uVar20 < uVar38) {
    uVar30 = uVar20;
  }
  uVar6 = (params->dist).max_distance;
  uVar12 = uVar20 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar12);
  uVar27 = (ulong)(*(long *)(ringbuffer + uVar12) * -0x42e1ca5843000000) >> 0x30;
  local_e0 = (ulong)*dist_cache;
  uVar29 = (uint8_t)*(long *)(ringbuffer + uVar12);
  uVar31 = (undefined4)uVar20;
  local_88 = (uint)ringbuffer_mask;
  if ((uVar20 - local_e0 < uVar20) &&
     (uVar36 = (ulong)((uint)(uVar20 - local_e0) & local_88), ringbuffer[uVar36] == uVar29)) {
    if (7 < local_f0) {
      local_c0 = local_f0 & 0xfffffffffffffff8;
      piVar18 = (int *)(ringbuffer + local_c0 + uVar12);
      lVar39 = 0;
      uVar35 = 0;
LAB_0010dc91:
      if (*(ulong *)(piVar2 + uVar35 * 2) == *(ulong *)(ringbuffer + uVar35 * 8 + uVar36))
      goto code_r0x0010dc9e;
      uVar35 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar36) ^ *(ulong *)(piVar2 + uVar35 * 2);
      uVar36 = 0;
      if (uVar35 != 0) {
        for (; (uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
        }
      }
      uVar35 = (uVar36 >> 3 & 0x1fffffff) - lVar39;
      goto LAB_0010dcea;
    }
    local_c0 = 0;
    piVar18 = piVar2;
LAB_0010e95e:
    uVar40 = local_f0 & 7;
    uVar35 = local_c0;
    if (uVar40 != 0) {
      uVar34 = local_c0 | uVar40;
      do {
        uVar35 = local_c0;
        if (ringbuffer[local_c0 + uVar36] != (uint8_t)*piVar18) break;
        piVar18 = (int *)((long)piVar18 + 1);
        local_c0 = local_c0 + 1;
        uVar40 = uVar40 - 1;
        uVar35 = uVar34;
      } while (uVar40 != 0);
    }
LAB_0010dcea:
    if ((3 < uVar35) && (uVar36 = uVar35 * 0x87 + 0x78f, 0x7e4 < uVar36)) {
      *(undefined4 *)(hasher + uVar27 * 4 + 0x28) = uVar31;
      iVar17 = 0;
      goto LAB_0010ddf8;
    }
  }
  uVar14 = *(uint *)(hasher + uVar27 * 4 + 0x28);
  *(undefined4 *)(hasher + uVar27 * 4 + 0x28) = uVar31;
  uVar36 = (ulong)(local_88 & uVar14);
  if (((ringbuffer[uVar36] == uVar29) && (uVar20 != uVar14)) &&
     (local_e0 = uVar20 - uVar14, local_e0 <= uVar30)) {
    if (7 < local_f0) {
      uVar40 = local_f0 & 0xfffffffffffffff8;
      piVar18 = (int *)(ringbuffer + uVar40 + uVar12);
      lVar39 = 0;
      uVar12 = 0;
LAB_0010dd81:
      if (*(ulong *)(piVar2 + uVar12 * 2) == *(ulong *)(ringbuffer + uVar12 * 8 + uVar36))
      goto code_r0x0010dd93;
      uVar36 = *(ulong *)(ringbuffer + uVar12 * 8 + uVar36) ^ *(ulong *)(piVar2 + uVar12 * 2);
      uVar12 = 0;
      if (uVar36 != 0) {
        for (; (uVar36 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
        }
      }
      uVar35 = (uVar12 >> 3 & 0x1fffffff) - lVar39;
      goto LAB_0010ddc5;
    }
    uVar40 = 0;
    piVar18 = piVar2;
LAB_0010e91f:
    uVar12 = local_f0 & 7;
    uVar35 = uVar40;
    if (uVar12 != 0) {
      uVar34 = uVar40 | uVar12;
      do {
        uVar35 = uVar40;
        if (ringbuffer[uVar40 + uVar36] != (uint8_t)*piVar18) break;
        piVar18 = (int *)((long)piVar18 + 1);
        uVar40 = uVar40 + 1;
        uVar12 = uVar12 - 1;
        uVar35 = uVar34;
      } while (uVar12 != 0);
    }
LAB_0010ddc5:
    if (3 < uVar35) {
      iVar17 = 0x1f;
      if ((uint)local_e0 != 0) {
        for (; (uint)local_e0 >> iVar17 == 0; iVar17 = iVar17 + -1) {
        }
      }
      uVar36 = (ulong)(iVar17 * -0x1e + 0x780) + uVar35 * 0x87;
      iVar17 = 0;
      if (0x7e4 < uVar36) goto LAB_0010ddf8;
    }
    if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
      uVar23 = (params->dictionary).hash_table[(ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12) * 2];
      *(ulong *)(hasher + 0x18) = *(ulong *)(hasher + 0x18) + 1;
      if ((ulong)uVar23 == 0) goto LAB_0010e334;
      uVar14 = uVar23 & 0x1f;
      uVar12 = (ulong)uVar14;
      if (local_f0 < uVar12) goto LAB_0010e334;
      pBVar7 = (params->dictionary).words;
      puVar19 = pBVar7->data + (ulong)pBVar7->offsets_by_length[uVar12] + uVar12 * (uVar23 >> 5);
      if (7 < uVar12) {
        uVar36 = (ulong)(uVar23 & 0x18);
        lVar39 = 0;
        uVar35 = 0;
LAB_0010e5c5:
        if (*(ulong *)(puVar19 + uVar35 * 8) == *(ulong *)(piVar2 + uVar35 * 2))
        goto code_r0x0010e5d2;
        uVar35 = *(ulong *)(piVar2 + uVar35 * 2) ^ *(ulong *)(puVar19 + uVar35 * 8);
        uVar36 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        uVar35 = (uVar36 >> 3 & 0x1fffffff) - lVar39;
        goto LAB_0010e622;
      }
      uVar36 = 0;
      goto LAB_0010e9a1;
    }
    goto LAB_0010e334;
  }
  goto LAB_0010e343;
code_r0x0010dc9e:
  uVar35 = uVar35 + 1;
  lVar39 = lVar39 + -8;
  if (local_f0 >> 3 == uVar35) goto LAB_0010e95e;
  goto LAB_0010dc91;
code_r0x0010dd93:
  uVar12 = uVar12 + 1;
  lVar39 = lVar39 + -8;
  if (local_f0 >> 3 == uVar12) goto LAB_0010e91f;
  goto LAB_0010dd81;
code_r0x0010e5d2:
  uVar35 = uVar35 + 1;
  lVar39 = lVar39 + -8;
  if (uVar14 >> 3 == uVar35) goto code_r0x0010e5de;
  goto LAB_0010e5c5;
code_r0x0010e5de:
  puVar19 = puVar19 + -lVar39;
LAB_0010e9a1:
  uVar40 = (ulong)uVar23 & 7;
  uVar35 = uVar36;
  if ((uVar23 & 7) != 0) {
    uVar34 = uVar36 | uVar40;
    do {
      uVar35 = uVar36;
      if (*(uint8_t *)((long)piVar2 + uVar36) != *puVar19) break;
      puVar19 = puVar19 + 1;
      uVar36 = uVar36 + 1;
      uVar40 = uVar40 - 1;
      uVar35 = uVar34;
    } while (uVar40 != 0);
  }
LAB_0010e622:
  if (((uVar35 == 0) || ((params->dictionary).cutoffTransformsCount + uVar35 <= uVar12)) ||
     (local_e0 = uVar30 + 1 + (ulong)(uVar23 >> 5) +
                 ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                ((char)(uVar12 - uVar35) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar12 - uVar35) * 4 << (pBVar7->size_bits_by_length[uVar12] & 0x3f)),
     uVar6 < local_e0)) {
LAB_0010e334:
    *(undefined4 *)(hasher + uVar27 * 4 + 0x28) = uVar31;
  }
  else {
    iVar17 = 0x1f;
    if ((uint)local_e0 != 0) {
      for (; (uint)local_e0 >> iVar17 == 0; iVar17 = iVar17 + -1) {
      }
    }
    uVar36 = (uVar35 * 0x87 - (ulong)(uint)(iVar17 * 0x1e)) + 0x780;
    if (uVar36 < 0x7e4) goto LAB_0010e334;
    *(ulong *)(hasher + 0x20) = *(ulong *)(hasher + 0x20) + 1;
    *(undefined4 *)(hasher + uVar27 * 4 + 0x28) = uVar31;
    if (uVar36 != 0x7e4) {
      iVar17 = uVar14 - (int)uVar35;
LAB_0010ddf8:
      iVar5 = *dist_cache;
      uVar30 = (lVar3 + num_bytes) - uVar20;
      iVar21 = 0;
      uVar26 = uVar10;
LAB_0010de20:
      local_f0 = local_f0 - 1;
      uVar12 = uVar35 - 1;
      if (local_f0 <= uVar35 - 1) {
        uVar12 = local_f0;
      }
      if (4 < params->quality) {
        uVar12 = 0;
      }
      uVar27 = uVar20 + 1;
      local_c8 = uVar38;
      if (uVar27 < uVar38) {
        local_c8 = uVar27;
      }
      piVar2 = (int *)(ringbuffer + (uVar27 & ringbuffer_mask));
      uVar34 = (ulong)(*(long *)(ringbuffer + (uVar27 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
               0x30;
      uVar29 = *(uint8_t *)(uVar12 + (long)piVar2);
      uVar40 = uVar27 - (long)iVar5;
      uVar31 = (undefined4)uVar27;
      if ((uVar40 < uVar27) &&
         (uVar14 = (uint)uVar40 & local_88, uVar29 == ringbuffer[uVar12 + uVar14])) {
        if (7 < local_f0) {
          lVar39 = 0;
          uVar40 = 0;
LAB_0010ded5:
          if (*(ulong *)(piVar2 + uVar40 * 2) == *(ulong *)(ringbuffer + uVar40 * 8 + (ulong)uVar14)
             ) goto code_r0x0010dee7;
          uVar13 = *(ulong *)(ringbuffer + uVar40 * 8 + (ulong)uVar14) ^
                   *(ulong *)(piVar2 + uVar40 * 2);
          uVar40 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
          uVar40 = (uVar40 >> 3 & 0x1fffffff) - lVar39;
          goto LAB_0010df1c;
        }
        uVar40 = 0;
        piVar18 = piVar2;
        goto LAB_0010e269;
      }
      goto LAB_0010df5c;
    }
  }
LAB_0010e343:
  uVar10 = uVar10 + 1;
  position = uVar20 + 1;
  if (uVar26 < position) {
    if ((uint)((int)lVar25 * 4) + uVar26 < position) {
      uVar30 = uVar20 + 0x11;
      if (uVar4 <= uVar20 + 0x11) {
        uVar30 = uVar4;
      }
      for (; position < uVar30; position = position + 4) {
        *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                  -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)position;
        uVar10 = uVar10 + 4;
      }
    }
    else {
      uVar30 = uVar20 + 9;
      if (uVar4 <= uVar20 + 9) {
        uVar30 = uVar4;
      }
      for (; position < uVar30; position = position + 2) {
        *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                  -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)position;
        uVar10 = uVar10 + 2;
      }
    }
  }
LAB_0010e8be:
  uVar20 = position;
  if (uVar1 <= position + 8) goto LAB_0010e9f9;
  goto LAB_0010dbec;
code_r0x0010dee7:
  uVar40 = uVar40 + 1;
  lVar39 = lVar39 + -8;
  if (uVar30 >> 3 == uVar40) goto code_r0x0010def3;
  goto LAB_0010ded5;
code_r0x0010def3:
  uVar40 = -lVar39;
  piVar18 = (int *)((long)piVar2 - lVar39);
LAB_0010e269:
  uVar13 = local_f0 & 7;
  for (; (uVar13 != 0 && (ringbuffer[uVar40 + uVar14] == (uint8_t)*piVar18)); uVar40 = uVar40 + 1) {
    piVar18 = (int *)((long)piVar18 + 1);
    uVar13 = uVar13 - 1;
  }
LAB_0010df1c:
  if ((3 < uVar40) && (uVar13 = uVar40 * 0x87 + 0x78f, 0x7e4 < uVar13)) {
    *(undefined4 *)(hasher + uVar34 * 4 + 0x28) = uVar31;
    iVar37 = 0;
    uVar32 = (long)iVar5;
    goto LAB_0010e0ad;
  }
LAB_0010df5c:
  uVar14 = *(uint *)(hasher + uVar34 * 4 + 0x28);
  *(undefined4 *)(hasher + uVar34 * 4 + 0x28) = uVar31;
  uVar22 = local_88 & uVar14;
  uVar13 = 0x7e4;
  uVar40 = uVar12;
  if (uVar29 != ringbuffer[uVar12 + uVar22]) {
    iVar37 = 0;
    uVar32 = 0;
    goto LAB_0010e0ad;
  }
  if ((uVar27 == uVar14) || (uVar32 = uVar27 - uVar14, local_c8 < uVar32)) {
    uVar32 = 0;
    iVar37 = 0;
    goto LAB_0010e0ad;
  }
  if (7 < local_f0) {
    lVar39 = 0;
    uVar40 = 0;
LAB_0010dfb7:
    if (*(ulong *)(piVar2 + uVar40 * 2) == *(ulong *)(ringbuffer + uVar40 * 8 + (ulong)uVar22))
    goto code_r0x0010dfc9;
    uVar13 = *(ulong *)(ringbuffer + uVar40 * 8 + (ulong)uVar22) ^ *(ulong *)(piVar2 + uVar40 * 2);
    uVar40 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
      }
    }
    uVar40 = (uVar40 >> 3 & 0x1fffffff) - lVar39;
    goto LAB_0010e005;
  }
  uVar40 = 0;
  piVar18 = piVar2;
LAB_0010e23a:
  uVar13 = local_f0 & 7;
  for (; (uVar13 != 0 && (ringbuffer[uVar40 + uVar22] == (uint8_t)*piVar18)); uVar40 = uVar40 + 1) {
    piVar18 = (int *)((long)piVar18 + 1);
    uVar13 = uVar13 - 1;
  }
LAB_0010e005:
  iVar37 = 0;
  if (3 < uVar40) {
    iVar8 = 0x1f;
    if ((uint)uVar32 != 0) {
      for (; (uint)uVar32 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    uVar13 = (ulong)(iVar8 * -0x1e + 0x780) + uVar40 * 0x87;
    if (0x7e4 < uVar13) goto LAB_0010e0ad;
  }
  if (*(ulong *)(hasher + 0x20) < *(ulong *)(hasher + 0x18) >> 7) {
LAB_0010e08e:
    iVar37 = 0;
    uVar32 = 0;
    uVar13 = 0x7e4;
    uVar40 = uVar12;
  }
  else {
    uVar23 = (params->dictionary).hash_table[(ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12) * 2];
    *(ulong *)(hasher + 0x18) = *(ulong *)(hasher + 0x18) + 1;
    if ((ulong)uVar23 == 0) goto LAB_0010e08e;
    uVar14 = uVar23 & 0x1f;
    uVar13 = (ulong)uVar14;
    if (local_f0 < uVar13) goto LAB_0010e08e;
    pBVar7 = (params->dictionary).words;
    puVar19 = pBVar7->data + (ulong)pBVar7->offsets_by_length[uVar13] + uVar13 * (uVar23 >> 5);
    if (7 < uVar13) {
      local_b0 = (ulong)(uVar23 & 0x18);
      local_a8 = 0;
      uVar40 = 0;
LAB_0010e153:
      if (*(ulong *)(puVar19 + uVar40 * 8) == *(ulong *)(piVar2 + uVar40 * 2))
      goto code_r0x0010e165;
      uVar32 = *(ulong *)(piVar2 + uVar40 * 2) ^ *(ulong *)(puVar19 + uVar40 * 8);
      uVar40 = 0;
      if (uVar32 != 0) {
        for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = (uVar40 >> 3 & 0x1fffffff) - local_a8;
      goto LAB_0010e18f;
    }
    local_b0 = 0;
LAB_0010e298:
    uVar32 = (ulong)uVar23 & 7;
    uVar40 = local_b0;
    if ((uVar23 & 7) != 0) {
      uVar33 = local_b0 | uVar32;
      do {
        uVar40 = local_b0;
        if (*(uint8_t *)((long)piVar2 + local_b0) != *puVar19) break;
        puVar19 = puVar19 + 1;
        local_b0 = local_b0 + 1;
        uVar32 = uVar32 - 1;
        uVar40 = uVar33;
      } while (uVar32 != 0);
    }
LAB_0010e18f:
    if (((uVar40 == 0) || ((params->dictionary).cutoffTransformsCount + uVar40 <= uVar13)) ||
       (uVar32 = local_c8 + 1 + (ulong)(uVar23 >> 5) +
                 ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                ((char)(uVar13 - uVar40) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar13 - uVar40) * 4 << (pBVar7->size_bits_by_length[uVar13] & 0x3f)),
       uVar6 < uVar32)) {
LAB_0010e208:
      iVar37 = 0;
      uVar32 = 0;
      uVar13 = 0x7e4;
      uVar40 = uVar12;
    }
    else {
      iVar37 = 0x1f;
      if ((uint)uVar32 != 0) {
        for (; (uint)uVar32 >> iVar37 == 0; iVar37 = iVar37 + -1) {
        }
      }
      uVar13 = (uVar40 * 0x87 - (ulong)(uint)(iVar37 * 0x1e)) + 0x780;
      if (uVar13 < 0x7e4) goto LAB_0010e208;
      iVar37 = uVar14 - (int)uVar40;
      *(ulong *)(hasher + 0x20) = *(ulong *)(hasher + 0x20) + 1;
    }
  }
  *(undefined4 *)(hasher + uVar34 * 4 + 0x28) = uVar31;
LAB_0010e0ad:
  if (uVar13 < uVar36 + 0xaf) {
    uVar27 = uVar20;
    uVar12 = uVar26;
    uVar32 = local_e0;
    uVar40 = uVar35;
    iVar37 = iVar17;
    local_c8 = uVar38;
    if (uVar20 < uVar38) {
      local_c8 = uVar20;
    }
    goto LAB_0010e445;
  }
  uVar12 = uVar10 + 4;
  if (iVar21 == 3) goto LAB_0010e445;
  uVar12 = uVar26 + 1;
  iVar21 = iVar21 + 1;
  uVar34 = uVar20 + 9;
  uVar30 = uVar30 - 1;
  uVar26 = uVar12;
  uVar35 = uVar40;
  uVar20 = uVar27;
  uVar36 = uVar13;
  local_e0 = uVar32;
  iVar17 = iVar37;
  if (uVar1 <= uVar34) goto LAB_0010e445;
  goto LAB_0010de20;
code_r0x0010dfc9:
  uVar40 = uVar40 + 1;
  lVar39 = lVar39 + -8;
  if (uVar30 >> 3 == uVar40) goto code_r0x0010dfd5;
  goto LAB_0010dfb7;
code_r0x0010dfd5:
  uVar40 = -lVar39;
  piVar18 = (int *)((long)piVar2 - lVar39);
  goto LAB_0010e23a;
code_r0x0010e165:
  uVar40 = uVar40 + 1;
  local_a8 = local_a8 + -8;
  if (uVar14 >> 3 == uVar40) goto code_r0x0010e175;
  goto LAB_0010e153;
code_r0x0010e175:
  puVar19 = puVar19 + -local_a8;
  goto LAB_0010e298;
LAB_0010e445:
  if (local_c8 < uVar32) {
LAB_0010e466:
    uVar10 = uVar32 + 0xf;
LAB_0010e46b:
    if ((uVar32 <= local_c8) && (uVar10 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)uVar32;
    }
  }
  else {
    if (uVar32 != (long)*dist_cache) {
      uVar10 = 1;
      if (uVar32 != (long)dist_cache[1]) {
        uVar10 = (uVar32 + 3) - (long)*dist_cache;
        if (uVar10 < 7) {
          bVar11 = (byte)((int)uVar10 << 2);
          uVar14 = 0x9750468;
        }
        else {
          uVar10 = (uVar32 + 3) - (long)dist_cache[1];
          if (6 < uVar10) {
            uVar10 = 2;
            if ((uVar32 != (long)dist_cache[2]) && (uVar10 = 3, uVar32 != (long)dist_cache[3]))
            goto LAB_0010e466;
            goto LAB_0010e46b;
          }
          bVar11 = (byte)((int)uVar10 << 2);
          uVar14 = 0xfdb1ace;
        }
        uVar10 = (ulong)(uVar14 >> (bVar11 & 0x1f) & 0xf);
      }
      goto LAB_0010e46b;
    }
    uVar10 = 0;
  }
  uVar14 = (uint)uVar12;
  local_b8->insert_len_ = uVar14;
  local_b8->copy_len_ = iVar37 << 0x19 | (uint)uVar40;
  uVar20 = (ulong)(params->dist).num_direct_distance_codes;
  uVar26 = uVar20 + 0x10;
  uVar15 = 0;
  if (uVar26 <= uVar10) {
    uVar22 = (params->dist).distance_postfix_bits;
    bVar11 = (byte)uVar22;
    uVar20 = ((4L << (bVar11 & 0x3f)) + (uVar10 - uVar20)) - 0x10;
    uVar28 = 0x1f;
    uVar16 = (uint)uVar20;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar28 = (uVar28 ^ 0xffffffe0) + 0x1f;
    uVar30 = (ulong)((uVar20 >> ((ulong)uVar28 & 0x3f) & 1) != 0);
    lVar39 = (ulong)uVar28 - (ulong)uVar22;
    uVar10 = (~(-1 << (bVar11 & 0x1f)) & uVar16) + uVar26 +
             (uVar30 + lVar39 * 2 + 0xfffe << (bVar11 & 0x3f)) | lVar39 * 0x400;
    uVar15 = (uint32_t)(uVar20 - (uVar30 + 2 << ((byte)uVar28 & 0x3f)) >> (bVar11 & 0x3f));
  }
  local_b8->dist_prefix_ = (uint16_t)uVar10;
  local_b8->dist_extra_ = uVar15;
  if (5 < uVar12) {
    if (uVar12 < 0x82) {
      uVar14 = 0x1f;
      uVar22 = (uint)(uVar12 - 2);
      if (uVar22 != 0) {
        for (; uVar22 >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar14 = (int)(uVar12 - 2 >> ((char)(uVar14 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar14 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar12 < 0x842) {
      uVar22 = 0x1f;
      if (uVar14 - 0x42 != 0) {
        for (; uVar14 - 0x42 >> uVar22 == 0; uVar22 = uVar22 - 1) {
        }
      }
      uVar14 = (uVar22 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar14 = 0x15;
      if (0x1841 < uVar12) {
        uVar14 = (uint)(ushort)(0x17 - (uVar12 < 0x5842));
      }
    }
  }
  uVar22 = iVar37 + (uint)uVar40;
  if (uVar22 < 10) {
    uVar28 = uVar22 - 2;
  }
  else if (uVar22 < 0x86) {
    uVar22 = uVar22 - 6;
    uVar28 = 0x1f;
    if (uVar22 != 0) {
      for (; uVar22 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar28 = (uVar22 >> ((char)(uVar28 ^ 0xffffffe0) + 0x1fU & 0x1f)) + 0x42 +
             (uVar28 ^ 0xffffffe0) * 2;
  }
  else {
    uVar28 = 0x17;
    if (uVar22 < 0x846) {
      uVar28 = 0x1f;
      if (uVar22 - 0x46 != 0) {
        for (; uVar22 - 0x46 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar28 = (uVar28 ^ 0xffe0) + 0x2c;
    }
  }
  uVar9 = (ushort)uVar28;
  uVar23 = (uVar9 & 7) + ((ushort)uVar14 & 7) * 8;
  if ((((uVar10 & 0x3ff) == 0) && ((ushort)uVar14 < 8)) && (uVar9 < 0x10)) {
    if (7 < uVar9) {
      uVar23 = uVar23 | 0x40;
    }
  }
  else {
    iVar17 = ((uVar14 & 0xffff) >> 3) * 3 + ((uVar28 & 0xffff) >> 3);
    uVar23 = uVar23 + ((ushort)(0x520d40 >> ((char)iVar17 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar17 * 0x40 + 0x40;
  }
  local_b8->cmd_prefix_ = uVar23;
  *num_literals = *num_literals + uVar12;
  position = uVar40 + uVar27;
  uVar10 = sVar24;
  if (position < sVar24) {
    uVar10 = position;
  }
  uVar20 = uVar27 + 2;
  if (uVar32 < uVar40 >> 2) {
    uVar26 = position + uVar32 * -4;
    if (uVar26 < uVar20) {
      uVar26 = uVar20;
    }
    uVar20 = uVar26;
    if (uVar10 < uVar26) {
      uVar20 = uVar10;
    }
  }
  uVar26 = uVar40 * 2 + uVar27 + lVar25;
  local_b8 = local_b8 + 1;
  if (uVar20 < uVar10) {
    do {
      *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (uVar20 & ringbuffer_mask)) *
                                -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)uVar20;
      uVar20 = uVar20 + 1;
    } while (uVar10 != uVar20);
  }
  uVar10 = 0;
  goto LAB_0010e8be;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}